

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_d.h
# Opt level: O0

void __thiscall
draco::VectorD<unsigned_int,2>::VectorD<int,2>
          (VectorD<unsigned_int,_2> *this,VectorD<int,_2> *src_vector)

{
  value_type_conflict5 *pvVar1;
  reference pvVar2;
  array<unsigned_int,_2UL> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  value_type_conflict5 in_stack_ffffffffffffffdc;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 2; local_14 = local_14 + 1) {
    if (local_14 < 2) {
      pvVar1 = (value_type_conflict5 *)
               VectorD<int,_2>::operator[]((VectorD<int,_2> *)in_RDI,in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffdc = *pvVar1;
      pvVar2 = std::array<unsigned_int,_2UL>::operator[]
                         (in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      *pvVar2 = in_stack_ffffffffffffffdc;
    }
    else {
      pvVar2 = std::array<unsigned_int,_2UL>::operator[]
                         (in_RDI,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      *pvVar2 = 0;
    }
  }
  return;
}

Assistant:

explicit VectorD(const VectorD<OtherScalarT, other_dimension_t> &src_vector) {
    for (int i = 0; i < dimension; ++i) {
      if (i < other_dimension_t) {
        v_[i] = Scalar(src_vector[i]);
      } else {
        v_[i] = Scalar(0);
      }
    }
  }